

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BloomFilter.hpp
# Opt level: O3

void __thiscall
supermap::BloomFilter<supermap::Key<3UL>_>::add
          (BloomFilter<supermap::Key<3UL>_> *this,Key<3UL> *value)

{
  ulong *puVar1;
  pointer puVar2;
  Hasher *pHVar3;
  _Bit_type *p_Var4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  int iVar7;
  undefined4 extraout_var;
  ulong uVar8;
  IllegalStateException *this_00;
  ulong uVar9;
  unsigned_long *seed;
  pointer puVar10;
  string data;
  string local_50;
  
  if (((this->elements_).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
       ._M_start.super__Bit_iterator_base._M_p ==
       (this->elements_).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
       ._M_finish.super__Bit_iterator_base._M_p) &&
     ((this->elements_).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_finish.super__Bit_iterator_base._M_offset == 0)) {
    this_00 = (IllegalStateException *)__cxa_allocate_exception(0x10);
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_50,"Filter size was not reserved or was set to zero","");
    supermap::IllegalStateException::IllegalStateException(this_00,(string *)&local_50);
    __cxa_throw(this_00,&IllegalStateException::typeinfo,std::logic_error::~logic_error);
  }
  BloomFilter<supermap::Key<3ul>>::serialize_abi_cxx11_(&local_50,this,value);
  puVar10 = (this->seeds_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
            .super__Vector_impl_data._M_start;
  puVar2 = (this->seeds_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (puVar10 != puVar2) {
    do {
      pHVar3 = (this->hasher_)._M_t.
               super___uniq_ptr_impl<supermap::Hasher,_std::default_delete<supermap::Hasher>_>._M_t.
               super__Tuple_impl<0UL,_supermap::Hasher_*,_std::default_delete<supermap::Hasher>_>.
               super__Head_base<0UL,_supermap::Hasher_*,_false>._M_head_impl;
      iVar7 = (*(pHVar3->super_Cloneable<supermap::Hasher>)._vptr_Cloneable[3])
                        (pHVar3,&local_50,*puVar10);
      auVar6._4_4_ = extraout_var;
      auVar6._0_4_ = iVar7;
      p_Var4 = (this->elements_).super__Bvector_base<std::allocator<bool>_>._M_impl.
               super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
      auVar5._8_8_ = 0;
      auVar5._0_8_ = (ulong)(this->elements_).super__Bvector_base<std::allocator<bool>_>._M_impl.
                            super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset +
                     ((long)(this->elements_).super__Bvector_base<std::allocator<bool>_>._M_impl.
                            super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p -
                     (long)p_Var4) * 8;
      auVar6._8_8_ = 0;
      uVar9 = SUB168(auVar6 % auVar5,0);
      uVar8 = uVar9 + 0x3f;
      if (-1 < (long)uVar9) {
        uVar8 = uVar9;
      }
      puVar1 = p_Var4 + ((long)uVar8 >> 6) +
                        (ulong)((uVar9 & 0x800000000000003f) < 0x8000000000000001) +
                        0xffffffffffffffff;
      *puVar1 = *puVar1 | 1L << (SUB161(auVar6 % auVar5,0) & 0x3f);
      puVar10 = puVar10 + 1;
    } while (puVar10 != puVar2);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void add(const T &value) override {
        if (elements_.empty()) {
            throw supermap::IllegalStateException("Filter size was not reserved or was set to zero");
        }
        std::string data = serialize(value);
        for (auto &seed : seeds_) {
            std::uint64_t index = getHashWithSeed(data, seed);
            elements_[index] = true;
        }
    }